

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_281dd4::check<unsigned_short>(istream *is,unsigned_short c)

{
  ostream *poVar1;
  uchar b [2];
  
  std::istream::read((char *)is,(long)b);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           _endl<char,std::char_traits<char>> +
                           (*_endl<char,std::char_traits<char>> == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)b);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (b == (uchar  [2])c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = unsigned short]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}